

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_flats.cpp
# Opt level: O3

void __thiscall GLFlat::ProcessLights(GLFlat *this,bool istrans)

{
  uint uVar1;
  sector_t *psVar2;
  FDrawInfo *pFVar3;
  subsector_t *psVar4;
  long lVar5;
  undefined8 *puVar6;
  
  this->dynlightindex = (GLRenderer->mLights->mIndices).Count;
  psVar2 = this->sector;
  if (0 < psVar2->subsectorcount) {
    lVar5 = 0;
    pFVar3 = gl_drawinfo;
    psVar4 = subsectors;
    do {
      if (((pFVar3->ss_renderflags).Array
           [((long)psVar2->subsectors[lVar5] - (long)psVar4 >> 5) * -0x5555555555555555] &
          this->renderflags) != 0 || istrans) {
        SetupSubsectorLights(this,1,psVar2->subsectors[lVar5],(int *)0x0);
        psVar2 = this->sector;
        pFVar3 = gl_drawinfo;
        psVar4 = subsectors;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < psVar2->subsectorcount);
  }
  if ((this->renderflags & 4) == 0) {
    if ((this->renderflags & 1) == 0) {
      lVar5 = 0x98;
      uVar1 = (gl_drawinfo->otherceilingplanes).Count;
    }
    else {
      lVar5 = 0x88;
      uVar1 = (gl_drawinfo->otherfloorplanes).Count;
    }
    if ((uint)psVar2->sectornum < uVar1) {
      for (puVar6 = *(undefined8 **)
                     (*(long *)(&gl_drawinfo->temporary + lVar5) +
                     (ulong)(uint)psVar2->sectornum * 8); puVar6 != (undefined8 *)0x0;
          puVar6 = (undefined8 *)*puVar6) {
        SetupSubsectorLights(this,1,(subsector_t *)puVar6[1],(int *)0x0);
      }
    }
  }
  return;
}

Assistant:

void GLFlat::ProcessLights(bool istrans)
{
	dynlightindex = GLRenderer->mLights->GetIndexPtr();

	// Draw the subsectors belonging to this sector
	for (int i=0; i<sector->subsectorcount; i++)
	{
		subsector_t * sub = sector->subsectors[i];
		if (gl_drawinfo->ss_renderflags[sub-subsectors]&renderflags || istrans)
		{
			SetupSubsectorLights(GLPASS_LIGHTSONLY, sub);
		}
	}

	// Draw the subsectors assigned to it due to missing textures
	if (!(renderflags&SSRF_RENDER3DPLANES))
	{
		gl_subsectorrendernode * node = (renderflags&SSRF_RENDERFLOOR)?
			gl_drawinfo->GetOtherFloorPlanes(sector->sectornum) :
			gl_drawinfo->GetOtherCeilingPlanes(sector->sectornum);

		while (node)
		{
			SetupSubsectorLights(GLPASS_LIGHTSONLY, node->sub);
			node = node->next;
		}
	}
}